

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void init_ref_frame_space(AV1_COMP *cpi,ThreadData_conflict *td,int mi_row,int mi_col)

{
  bool bVar1;
  TplDepStats *pTVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int idx_2;
  int cutoff_ref;
  int tmp;
  int i;
  int idx_1;
  int rank_index [6];
  int rf_idx;
  int idx;
  int best_rf_idx;
  int64_t best_inter_cost;
  int64_t tpl_pred_error [7];
  TplDepStats *this_stats;
  int col;
  int row;
  int col_step_sr;
  int row_step;
  int mi_col_end_sr;
  int mi_col_sr;
  int mi_cols_sr;
  int mi_row_end;
  BLOCK_SIZE sb_size;
  int step;
  int64_t inter_cost [7];
  int tpl_stride;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  int is_overlay;
  uint8_t block_mis_log2;
  TplParams *tpl_data;
  int frame_idx;
  MACROBLOCK *x;
  CommonModeInfoParams *mi_params;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  int local_164;
  int local_160;
  int local_15c;
  int local_150;
  int local_14c;
  int aiStack_148 [7];
  int local_12c;
  int local_128;
  int local_124;
  long local_120;
  long local_118 [8];
  TplDepStats *local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  byte local_ad;
  int local_ac;
  long local_a8 [8];
  int local_64;
  TplDepStats *local_60;
  TplDepFrame *local_58;
  uint local_50;
  byte local_49;
  TplParams *local_48;
  uint local_3c;
  long local_38;
  long *local_30;
  GF_GROUP *local_28;
  long *local_20;
  int local_18;
  int local_14;
  long *local_8;
  
  local_20 = in_RDI + 0x77f0;
  local_28 = (GF_GROUP *)(*in_RDI + 400);
  local_30 = in_RDI + 0x7831;
  local_3c = (uint)*(byte *)(in_RDI + 0xe258);
  local_48 = (TplParams *)(*in_RDI + 0xd2a8);
  local_49 = *(byte *)(*in_RDI + 0xd2ac);
  local_38 = in_RSI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  memset((void *)(in_RSI + 0x15dd8),0,8);
  iVar3 = av1_tpl_stats_ready(local_48,local_3c);
  if (((iVar3 != 0) &&
      (iVar3 = is_frame_tpl_eligible(local_28,(uint8_t)local_8[0xe258]), iVar3 != 0)) &&
     ((char)local_8[0x8480] == '\0')) {
    local_50 = (uint)(*(char *)(*local_8 + 400 + (long)(int)local_3c) == '\x04');
    if (local_50 == 0) {
      local_58 = local_48->tpl_frame + (int)local_3c;
      local_60 = local_58->tpl_stats_ptr;
      local_64 = local_58->stride;
      memset(local_a8,0,0x38);
      local_ac = 1 << (local_49 & 0x1f);
      local_ad = *(byte *)(local_20[0xc11] + 0x1c);
      if ((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [local_ad] + local_14) < *(int *)((long)local_30 + 0xc)) {
        local_160 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [local_ad] + local_14;
      }
      else {
        local_160 = *(int *)((long)local_30 + 0xc);
      }
      local_b4 = local_160;
      local_b8 = av1_pixels_to_mi((int)local_20[9]);
      local_bc = coded_to_superres_mi(local_18,(uint)*(byte *)(local_20 + 10));
      iVar3 = coded_to_superres_mi
                        (local_18 +
                         (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [local_ad],(uint)*(byte *)(local_20 + 10));
      if (iVar3 < local_b8) {
        local_164 = coded_to_superres_mi
                              (local_18 +
                               (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [local_ad],(uint)*(byte *)(local_20 + 10));
      }
      else {
        local_164 = local_b8;
      }
      local_c0 = local_164;
      local_c4 = local_ac;
      local_c8 = coded_to_superres_mi(local_ac,(uint)*(byte *)(local_20 + 10));
      for (local_cc = local_14; local_cc < local_b4; local_cc = local_c4 + local_cc) {
        for (local_d0 = local_bc; pTVar2 = local_60, local_d0 < local_c0;
            local_d0 = local_c8 + local_d0) {
          iVar3 = av1_tpl_ptr_pos(local_cc,local_d0,local_64,local_49);
          local_d8 = pTVar2 + iVar3;
          memset(local_118,0,0x38);
          local_120 = local_d8->pred_error[0];
          local_124 = 0;
          for (local_128 = 1; local_128 < 7; local_128 = local_128 + 1) {
            if ((local_d8->pred_error[local_128] < local_120) &&
               (local_d8->pred_error[local_128] != 0)) {
              local_120 = local_d8->pred_error[local_128];
              local_124 = local_128;
            }
          }
          local_118[local_124] = local_d8->pred_error[local_124] - local_d8->pred_error[0];
          for (local_12c = 1; local_12c < 7; local_12c = local_12c + 1) {
            local_a8[local_12c] = local_118[local_12c] + local_a8[local_12c];
          }
        }
      }
      for (local_14c = 0; local_14c < 6; local_14c = local_14c + 1) {
        aiStack_148[local_14c] = local_14c + 1;
        for (local_150 = local_14c; 0 < local_150; local_150 = local_150 + -1) {
          if (local_a8[aiStack_148[local_150]] < local_a8[aiStack_148[local_150 + -1]]) {
            iVar3 = aiStack_148[local_150 + -1];
            aiStack_148[local_150 + -1] = aiStack_148[local_150];
            aiStack_148[local_150] = iVar3;
          }
        }
      }
      *(undefined1 *)(local_38 + 0x15dd8) = 1;
      *(undefined1 *)(local_38 + 0x15dd9) = 1;
      bVar1 = false;
      for (local_15c = 0; local_15c < 6; local_15c = local_15c + 1) {
        *(undefined1 *)(local_38 + 0x15dd8 + (long)(aiStack_148[local_15c] + 1)) = 1;
        if (2 < local_15c) {
          if (!bVar1) {
            lVar4 = local_a8[aiStack_148[local_15c]];
            if (lVar4 < 1) {
              lVar4 = -lVar4;
            }
            lVar5 = local_a8[aiStack_148[local_15c + -1]];
            if (lVar5 < 1) {
              lVar5 = -lVar5;
            }
            if ((lVar4 < lVar5 / 8) || (local_a8[aiStack_148[local_15c]] == 0)) {
              bVar1 = true;
            }
          }
          if (bVar1) {
            *(undefined1 *)(local_38 + 0x15dd8 + (long)(aiStack_148[local_15c] + 1)) = 0;
          }
        }
      }
    }
    else {
      memset((void *)(local_38 + 0x15dd8),1,8);
    }
  }
  return;
}

Assistant:

static void init_ref_frame_space(AV1_COMP *cpi, ThreadData *td, int mi_row,
                                 int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCK *x = &td->mb;
  const int frame_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;

  av1_zero(x->tpl_keep_ref_frame);

  if (!av1_tpl_stats_ready(tpl_data, frame_idx)) return;
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) return;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return;

  const int is_overlay =
      cpi->ppi->gf_group.update_type[frame_idx] == OVERLAY_UPDATE;
  if (is_overlay) {
    memset(x->tpl_keep_ref_frame, 1, sizeof(x->tpl_keep_ref_frame));
    return;
  }

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[frame_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  const int tpl_stride = tpl_frame->stride;
  int64_t inter_cost[INTER_REFS_PER_FRAME] = { 0 };
  const int step = 1 << block_mis_log2;
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  const int mi_row_end =
      AOMMIN(mi_size_high[sb_size] + mi_row, mi_params->mi_rows);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      AOMMIN(coded_to_superres_mi(mi_col + mi_size_wide[sb_size],
                                  cm->superres_scale_denominator),
             mi_cols_sr);
  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < mi_row_end; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      const TplDepStats *this_stats =
          &tpl_stats[av1_tpl_ptr_pos(row, col, tpl_stride, block_mis_log2)];
      int64_t tpl_pred_error[INTER_REFS_PER_FRAME] = { 0 };
      // Find the winner ref frame idx for the current block
      int64_t best_inter_cost = this_stats->pred_error[0];
      int best_rf_idx = 0;
      for (int idx = 1; idx < INTER_REFS_PER_FRAME; ++idx) {
        if ((this_stats->pred_error[idx] < best_inter_cost) &&
            (this_stats->pred_error[idx] != 0)) {
          best_inter_cost = this_stats->pred_error[idx];
          best_rf_idx = idx;
        }
      }
      // tpl_pred_error is the pred_error reduction of best_ref w.r.t.
      // LAST_FRAME.
      tpl_pred_error[best_rf_idx] = this_stats->pred_error[best_rf_idx] -
                                    this_stats->pred_error[LAST_FRAME - 1];

      for (int rf_idx = 1; rf_idx < INTER_REFS_PER_FRAME; ++rf_idx)
        inter_cost[rf_idx] += tpl_pred_error[rf_idx];
    }
  }

  int rank_index[INTER_REFS_PER_FRAME - 1];
  for (int idx = 0; idx < INTER_REFS_PER_FRAME - 1; ++idx) {
    rank_index[idx] = idx + 1;
    for (int i = idx; i > 0; --i) {
      if (inter_cost[rank_index[i - 1]] > inter_cost[rank_index[i]]) {
        const int tmp = rank_index[i - 1];
        rank_index[i - 1] = rank_index[i];
        rank_index[i] = tmp;
      }
    }
  }

  x->tpl_keep_ref_frame[INTRA_FRAME] = 1;
  x->tpl_keep_ref_frame[LAST_FRAME] = 1;

  int cutoff_ref = 0;
  for (int idx = 0; idx < INTER_REFS_PER_FRAME - 1; ++idx) {
    x->tpl_keep_ref_frame[rank_index[idx] + LAST_FRAME] = 1;
    if (idx > 2) {
      if (!cutoff_ref) {
        // If the predictive coding gains are smaller than the previous more
        // relevant frame over certain amount, discard this frame and all the
        // frames afterwards.
        if (llabs(inter_cost[rank_index[idx]]) <
                llabs(inter_cost[rank_index[idx - 1]]) / 8 ||
            inter_cost[rank_index[idx]] == 0)
          cutoff_ref = 1;
      }

      if (cutoff_ref) x->tpl_keep_ref_frame[rank_index[idx] + LAST_FRAME] = 0;
    }
  }
}